

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

void __thiscall
pbrt::Array2D<pbrt::SPPMPixel>::Array2D
          (Array2D<pbrt::SPPMPixel> *this,Bounds2i *extent,allocator_type allocator)

{
  SPPMPixel *pSVar1;
  undefined1 auVar3 [12];
  undefined1 auVar2 [64];
  SPPMPixel *pSVar4;
  Tuple2<pbrt::Point2,_int> TVar5;
  int iVar6;
  undefined4 extraout_var;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  
  TVar5 = (extent->pMax).super_Tuple2<pbrt::Point2,_int>;
  (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
       (extent->pMin).super_Tuple2<pbrt::Point2,_int>;
  (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar5;
  (this->allocator).memoryResource = allocator.memoryResource;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = (extent->pMax).super_Tuple2<pbrt::Point2,_int>;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (extent->pMin).super_Tuple2<pbrt::Point2,_int>;
  auVar14 = vpsubd_avx(auVar12,auVar14);
  auVar12 = vpshufd_avx(auVar14,0x55);
  auVar12 = vpmulld_avx(auVar12,auVar14);
  uVar11 = auVar12._0_4_;
  iVar6 = (*(allocator.memoryResource)->_vptr_memory_resource[2])
                    (allocator.memoryResource,(long)(int)uVar11 * 0xa0,8);
  this->values = (SPPMPixel *)CONCAT44(extraout_var,iVar6);
  if (0 < (int)uVar11) {
    lVar7 = 0x78;
    auVar13 = ZEXT1664((undefined1  [16])0x0);
    uVar8 = 0;
    do {
      pSVar4 = this->values;
      auVar2 = vmovdqu64_avx512f(auVar13);
      *(undefined1 (*) [64])
       &pSVar4[uVar8].vp.bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z = auVar2;
      pSVar1 = pSVar4 + uVar8;
      auVar2 = vmovdqu64_avx512f(auVar13);
      auVar3 = auVar2._4_12_;
      pSVar1->radius = (Float)auVar2._0_4_;
      (pSVar1->Ld).r = (Float)auVar3._0_4_;
      (pSVar1->Ld).g = (Float)auVar3._4_4_;
      (pSVar1->Ld).b = (Float)auVar3._8_4_;
      (pSVar1->vp).p = (Point3f)auVar2._16_12_;
      (pSVar1->vp).wo = (Vector3f)auVar2._28_12_;
      (pSVar1->vp).bsdf.eta = (Float)auVar2._40_4_;
      *(int *)&(pSVar1->vp).bsdf.field_0x4 = auVar2._44_4_;
      (pSVar1->vp).bsdf.bxdf = (BxDFHandle)auVar2._48_8_;
      (pSVar1->vp).bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar2._56_4_;
      (pSVar1->vp).bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar2._60_4_;
      auVar2 = vmovdqu64_avx512f(auVar13);
      *(undefined1 (*) [64])&pSVar4[uVar8].vp.bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.y = auVar2;
      pSVar4[uVar8].vp.bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x = 1.0;
      pSVar4[uVar8].vp.bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y = 1.0;
      pSVar4[uVar8].vp.bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
      *(undefined1 (*) [16])&pSVar4[uVar8].vp.bsdf.ng = (undefined1  [16])0x0;
      *(undefined1 (*) [16])pSVar4[uVar8].vp.beta.values.values = (undefined1  [16])0x0;
      lVar10 = 0;
      do {
        LOCK();
        *(undefined4 *)((long)(&(pSVar4->vp).beta + -7) + 8 + lVar10 + lVar7) = 0;
        UNLOCK();
        lVar10 = lVar10 + 4;
      } while (lVar10 != 0x10);
      uVar9 = uVar8 + 1;
      lVar7 = lVar7 + 0xa0;
      pSVar1 = pSVar4 + uVar8;
      pSVar1->M = (__atomic_base<int>)0x0;
      pSVar1->N = 0.0;
      (pSVar1->tau).r = 0.0;
      (pSVar1->tau).g = 0.0;
      pSVar4[uVar8].tau.b = 0.0;
      uVar8 = uVar9;
    } while (uVar9 != uVar11);
  }
  return;
}

Assistant:

Array2D(const Bounds2i &extent, allocator_type allocator = {})
        : extent(extent), allocator(allocator) {
        int n = extent.Area();
        values = allocator.allocate_object<T>(n);
        for (int i = 0; i < n; ++i)
            allocator.construct(values + i);
    }